

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O2

err_t cmdStCrc(octet *crc,char *prefix)

{
  bool_t bVar1;
  err_t eVar2;
  size_t in_RAX;
  size_t sVar3;
  char *path;
  file_t file;
  char *state;
  size_t sVar4;
  size_t count;
  
  count = in_RAX;
  bVar1 = memIsValid(crc,0x20);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    if ((prefix != (char *)0x0) && (bVar1 = strIsValid(prefix), bVar1 == 0)) {
      return 0x6d;
    }
    eVar2 = cmdSysModulePath((char *)0x0,&count);
    if (eVar2 == 0) {
      sVar4 = count;
      if (count < 0x1001) {
        sVar4 = 0x1000;
      }
      sVar3 = beltHash_keep();
      path = (char *)blobCreate(sVar4 + sVar3);
      if (path == (char *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        sVar4 = 0x1000;
        if (0x1000 < count) {
          sVar4 = count;
        }
        eVar2 = cmdSysModulePath(path,&count);
        if (eVar2 == 0) {
          file = fileOpen(path,"rb");
          if (file == (file_t)0x0) {
            eVar2 = 0xcb;
          }
          else {
            state = path + sVar4;
            beltHashStart(state);
            if (prefix != (char *)0x0) {
              sVar4 = strLen(prefix);
              beltHashStepH(prefix,sVar4,state);
            }
            do {
              count = fileRead2(path,0x1000,file);
              if (count == 0xffffffffffffffff) {
                fileClose(file);
                eVar2 = 0xcf;
                goto LAB_00107c09;
              }
              beltHashStepH(path,count,state);
            } while (count != 0);
            bVar1 = fileClose(file);
            if (bVar1 == 0) {
              eVar2 = 0x67;
            }
            else {
              beltHashStepG(crc,state);
              eVar2 = 0;
            }
          }
        }
LAB_00107c09:
        blobClose(path);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t cmdStCrc(octet crc[32], const char* prefix)
{
	const size_t buf_size = 4096;
	err_t code;
	size_t count;
	void* stack;
	char* name;
	octet* buf;
	void* state;
	file_t file;
	// входной контроль
	if (!memIsValid(crc, 32) || !strIsNullOrValid(prefix))
		return ERR_BAD_INPUT;
	// определить длину имени исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	// выделить и разметить память	
	code = cmdBlobCreate(stack, MAX2(buf_size, count) + beltHash_keep());
	ERR_CALL_CHECK(code);
	buf = (octet*)stack;
	name = (char*)stack;
	state = buf + MAX2(buf_size, count);
	// определить имя исполняемого модуля
	code = cmdSysModulePath(name, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// открыть исполнямый модуль
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// начать хэширование
	beltHashStart(state);
	if (prefix)
		beltHashStepH(prefix, strLen(prefix), state);
	// хэшировать файл
	do
	{
		if ((count = fileRead2(buf, buf_size, file)) == SIZE_MAX)
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		beltHashStepH(buf, count, state);
	} while (count);
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// завершить
	beltHashStepG(crc, state);
	cmdBlobClose(stack);
	return code;
}